

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test6.cpp
# Opt level: O0

int main(void)

{
  Writer *pWVar1;
  EventLoop *pEVar2;
  Writer local_298;
  TimerId local_220;
  TimerCallback local_210;
  Functor local_1f0;
  EventLoop *local_1d0;
  EventLoop *loop;
  EventLoopThread loopThread;
  __pid_t local_90 [4];
  Writer local_80;
  
  el::base::Writer::Writer
            (&local_80,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/tests/test6.cpp"
             ,0x13,"int main()",NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_80,1,el::base::consts::kDefaultLoggerId);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [13])"main: pid = ");
  local_90[0] = getpid();
  pWVar1 = el::base::Writer::operator<<(pWVar1,local_90);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [9])", tid = ");
  loopThread._cond._pcond.__data.__g_signals[1] = mario::CurrentThread::tid();
  el::base::Writer::operator<<(pWVar1,(int *)(loopThread._cond._pcond.__size + 0x2c));
  el::base::Writer::~Writer(&local_80);
  mario::EventLoopThread::EventLoopThread((EventLoopThread *)&loop);
  pEVar2 = mario::EventLoopThread::startLoop((EventLoopThread *)&loop);
  local_1d0 = pEVar2;
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_1f0,runInThread);
  mario::EventLoop::runInLoop(pEVar2,&local_1f0);
  std::function<void_()>::~function(&local_1f0);
  sleep(1);
  pEVar2 = local_1d0;
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_210,runInThread);
  local_220 = mario::EventLoop::runEvery(pEVar2,1.0,&local_210);
  std::function<void_()>::~function(&local_210);
  sleep(5);
  mario::EventLoop::quit(local_1d0);
  el::base::Writer::Writer
            (&local_298,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/tests/test6.cpp"
             ,0x1e,"int main()",NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_298,1,el::base::consts::kDefaultLoggerId);
  el::base::Writer::operator<<(pWVar1,(char (*) [10])"exit main");
  el::base::Writer::~Writer(&local_298);
  mario::EventLoopThread::~EventLoopThread((EventLoopThread *)&loop);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::EventLoopThread loopThread;
    mario::EventLoop* loop = loopThread.startLoop();

    loop->runInLoop(runInThread);
    sleep(1);
    loop->runEvery(1, runInThread);
    sleep(5);
    loop->quit();

    LOG(INFO) << "exit main";
}